

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggressorAccessPattern.cpp
# Opt level: O3

bool operator==(AggressorAccessPattern *lhs,AggressorAccessPattern *rhs)

{
  bool bVar1;
  
  if (((lhs->frequency == rhs->frequency) && (lhs->amplitude == rhs->amplitude)) &&
     (lhs->start_offset == rhs->start_offset)) {
    bVar1 = (long)(lhs->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(lhs->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
            (long)(rhs->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(rhs->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                  _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator==(const AggressorAccessPattern &lhs, const AggressorAccessPattern &rhs) {
  return
      lhs.frequency==rhs.frequency &&
          lhs.amplitude==rhs.amplitude &&
          lhs.start_offset==rhs.start_offset &&
          // actually we should compare the aggressors here but we skip that because it would require us to implement a
          // comparison function for Aggressor too
          lhs.aggressors.size()==rhs.aggressors.size();
}